

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O2

void Assimp::SceneCombiner::Copy(aiAnimMesh **_dest,aiAnimMesh *src)

{
  aiAnimMesh *this;
  long lVar1;
  
  if (src != (aiAnimMesh *)0x0 && _dest != (aiAnimMesh **)0x0) {
    this = (aiAnimMesh *)operator_new(0x4b0);
    aiAnimMesh::aiAnimMesh(this);
    *_dest = this;
    memcpy(this,src,0x4b0);
    GetArrayCopy<aiVector3t<float>>(&this->mVertices,this->mNumVertices);
    GetArrayCopy<aiVector3t<float>>(&this->mNormals,this->mNumVertices);
    GetArrayCopy<aiVector3t<float>>(&this->mTangents,this->mNumVertices);
    GetArrayCopy<aiVector3t<float>>(&this->mBitangents,this->mNumVertices);
    for (lVar1 = 0; (lVar1 != 0x40 && (*(long *)((long)this->mTextureCoords + lVar1) != 0));
        lVar1 = lVar1 + 8) {
      GetArrayCopy<aiVector3t<float>>
                ((aiVector3t<float> **)((long)this->mTextureCoords + lVar1),this->mNumVertices);
    }
    for (lVar1 = 0; (lVar1 != 0x40 && (*(long *)((long)this->mColors + lVar1) != 0));
        lVar1 = lVar1 + 8) {
      GetArrayCopy<aiColor4t<float>>
                ((aiColor4t<float> **)((long)this->mColors + lVar1),this->mNumVertices);
    }
  }
  return;
}

Assistant:

void SceneCombiner::Copy(aiAnimMesh** _dest, const aiAnimMesh* src) {
    if (nullptr == _dest || nullptr == src) {
        return;
    }

    aiAnimMesh* dest = *_dest = new aiAnimMesh();

    // get a flat copy
    ::memcpy(dest, src, sizeof(aiAnimMesh));

    // and reallocate all arrays
    GetArrayCopy(dest->mVertices, dest->mNumVertices);
    GetArrayCopy(dest->mNormals, dest->mNumVertices);
    GetArrayCopy(dest->mTangents, dest->mNumVertices);
    GetArrayCopy(dest->mBitangents, dest->mNumVertices);

    unsigned int n = 0;
    while (dest->HasTextureCoords(n))
        GetArrayCopy(dest->mTextureCoords[n++], dest->mNumVertices);

    n = 0;
    while (dest->HasVertexColors(n))
        GetArrayCopy(dest->mColors[n++], dest->mNumVertices);
}